

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O1

ENCODING * findEncoding(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  int i;
  long lVar2;
  char **ppcVar3;
  char *p;
  char buf [128];
  char *local_a8;
  char *local_a0;
  char local_98 [127];
  char local_19;
  
  local_a8 = local_98;
  local_a0 = ptr;
  (*enc->utf8Convert)(enc,&local_a0,end,&local_a8,&local_19);
  if (local_a0 == end) {
    *local_a8 = '\0';
    iVar1 = streqci(local_98,"UTF-16");
    if ((iVar1 != 0) && (enc->minBytesPerChar == 2)) {
      return enc;
    }
    ppcVar3 = getEncodingIndex::encodingNames;
    lVar2 = 0;
    do {
      iVar1 = streqci(local_98,*ppcVar3);
      if (iVar1 != 0) goto LAB_00154acc;
      lVar2 = lVar2 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (lVar2 != 6);
    lVar2 = 0xffffffff;
LAB_00154acc:
    if ((int)lVar2 != -1) {
      return encodings[(int)lVar2];
    }
  }
  return (ENCODING *)0x0;
}

Assistant:

static
const ENCODING *NS(findEncoding)(const ENCODING *enc, const char *ptr, const char *end)
{
#define ENCODING_MAX 128
  char buf[ENCODING_MAX];
  char *p = buf;
  int i;
  XmlUtf8Convert(enc, &ptr, end, &p, p + ENCODING_MAX - 1);
  if (ptr != end)
    return 0;
  *p = 0;
  if (streqci(buf, KW_UTF_16) && enc->minBytesPerChar == 2)
    return enc;
  i = getEncodingIndex(buf);
  if (i == UNKNOWN_ENC)
    return 0;
  return NS(encodings)[i];
}